

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O2

BOOL __thiscall
Js::CustomExternalWrapperObject::EnsureInitialized
          (CustomExternalWrapperObject *this,ScriptContext *requestContext)

{
  DynamicObject *aValue;
  ThreadContext *this_00;
  bool bVar1;
  Attributes attributes;
  JavascriptFunction *function;
  Var pvVar2;
  ImplicitCallFlags IVar3;
  anon_class_24_3_b56ecbc3 local_50;
  bool local_31;
  
  if (this->initialized != false) {
    return 1;
  }
  aValue = ((this->super_DynamicObject).super_RecyclableObject.type.ptr[1].propertyCache.ptr)->
           elements[4].prototypeObjectWithProperty.ptr;
  if (aValue == (DynamicObject *)0x0) {
    return 1;
  }
  this_00 = requestContext->threadContext;
  if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_External;
    return 0;
  }
  this->initialized = true;
  function = VarTo<Js::JavascriptFunction>(aValue);
  local_31 = this_00->reentrancySafeOrHandled;
  this_00->reentrancySafeOrHandled = true;
  local_50.threadContext = this_00;
  local_50.initializeMethod = function;
  local_50.targetObj = (RecyclableObject *)this;
  attributes = FunctionInfo::GetAttributes((RecyclableObject *)function);
  bVar1 = ThreadContext::HasNoSideEffect(this_00,(RecyclableObject *)function,attributes);
  if (bVar1) {
    pvVar2 = EnsureInitialized::anon_class_24_3_b56ecbc3::operator()(&local_50);
    bVar1 = ThreadContext::IsOnStack(pvVar2);
LAB_00a0ddb3:
    if (bVar1 == false) goto LAB_00a0de02;
LAB_00a0dded:
    IVar3 = this_00->implicitCallFlags;
  }
  else {
    if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag)
    goto LAB_00a0dded;
    if ((attributes & HasNoSideEffect) != None) {
      pvVar2 = EnsureInitialized::anon_class_24_3_b56ecbc3::operator()(&local_50);
      bVar1 = ThreadContext::IsOnStack(pvVar2);
      goto LAB_00a0ddb3;
    }
    IVar3 = this_00->implicitCallFlags;
    EnsureInitialized::anon_class_24_3_b56ecbc3::operator()(&local_50);
  }
  this_00->implicitCallFlags = IVar3 | ImplicitCall_Accessor;
LAB_00a0de02:
  this_00->reentrancySafeOrHandled = local_31;
  return 1;
}

Assistant:

BOOL CustomExternalWrapperObject::EnsureInitialized(ScriptContext* requestContext)
{
    ThreadContext* threadContext = requestContext->GetThreadContext();
    if (this->initialized)
    {
        return TRUE;
    }
    void* initializeTrap = this->GetExternalType()->GetJsGetterSetterInterceptor()->initializeTrap;
    if (initializeTrap == nullptr)
    {
        return TRUE;
    }
    if (threadContext->IsDisableImplicitCall())
    {
        threadContext->AddImplicitCallFlags(Js::ImplicitCall_External);
        return FALSE;
    }

    this->initialized = true;
    JavascriptFunction * initializeMethod = Js::VarTo<JavascriptFunction>(initializeTrap);

    Js::RecyclableObject * targetObj = this;
    threadContext->ExecuteImplicitCall(initializeMethod, Js::ImplicitCall_Accessor, [=]()->Js::Var
    {
        return CALL_FUNCTION(threadContext, initializeMethod, Js::CallInfo(Js::CallFlags_Value, 1), targetObj);
    });
    return TRUE;
}